

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

ags_t AGSSock::Socket_SendTo(Socket *sock,SockAddr *addr,char *str)

{
  size_t __n;
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  
  __n = strlen(str);
  bVar4 = __n == 0;
  if (!bVar4) {
    while (sVar1 = sendto(sock->id,str,__n,0,(sockaddr *)addr,0x80), sVar1 != -1) {
      __n = __n - sVar1;
      bVar4 = __n == 0;
      if (bVar4) break;
      str = str + sVar1;
    }
  }
  piVar2 = __errno_location();
  iVar3 = 0;
  if (*piVar2 != 0xb) {
    iVar3 = *piVar2;
  }
  sock->error = iVar3;
  return (ulong)bVar4;
}

Assistant:

ags_t Socket_SendTo(Socket *sock, const SockAddr *addr, const char *str)
{
	return sendto_impl(sock, addr, str, strlen(str));
}